

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexicon.cpp
# Opt level: O3

void __thiscall Lexico::Lexico(Lexico *this)

{
  memset(this,0,0x133c);
  *(int *)((long)(this->automato + 1) + 0) = 2;
  *(int *)((long)(this->automato + 1) + 4) = 3;
  *(int *)((long)(this->automato + 1) + 8) = 4;
  *(int *)((long)(this->automato + 1) + 0xc) = 5;
  *(int *)((long)(this->automato + 1) + 0x10) = 6;
  *(int *)((long)(this->automato + 1) + 0x14) = 7;
  *(int *)((long)(this->automato + 1) + 0x18) = 8;
  *(int *)((long)(this->automato + 1) + 0x1c) = 9;
  *(int *)((long)(this->automato + 1) + 0x20) = 10;
  *(int *)((long)(this->automato + 1) + 0x24) = 0xb;
  *(int *)((long)(this->automato + 1) + 0x28) = 0xc;
  *(int *)((long)(this->automato + 1) + 0x2c) = 0xd;
  *(int *)((long)(this->automato + 1) + 0x30) = 0xe;
  *(int *)((long)(this->automato + 1) + 0x34) = 0xf;
  *(int *)((long)(this->automato + 1) + 0x38) = 0x10;
  *(int *)((long)(this->automato + 1) + 0x3c) = 0x11;
  *(int *)((long)(this->automato + 1) + 0x40) = 0x12;
  *(int *)((long)(this->automato + 1) + 0x44) = 0x13;
  *(int *)((long)(this->automato + 1) + 0x48) = 0x14;
  *(int *)((long)(this->automato + 1) + 0x4c) = 0x15;
  *(int *)((long)(this->automato + 1) + 0x50) = 0x16;
  *(int *)((long)(this->automato + 1) + 0x54) = 0x17;
  this->automato[2][0] = 2;
  this->automato[3][1] = 3;
  this->automato[5][2] = 0x1d;
  this->automato[5][4] = 0x1c;
  this->automato[6][2] = 0x1e;
  this->automato[0xb][2] = 0x1b;
  this->automato[10][8] = 0x18;
  this->automato[0xc][0xb] = 0x19;
  this->automato[0x10][0xf] = 0x1a;
  builtin_strncpy(this->indice,"a0=<>+-*/:()[]{},\n ;.\t",0x16);
  return;
}

Assistant:

Lexico::Lexico() {
  for (int i = 0; i < estados; i++){
    for (int j = 0; j < alfabeto; j++){
      automato[i][j] = 0;
    }
  }

  automato[1][0]   = LETRA;
  automato[1][1]   = DIGITO;
  automato[1][2]   = IGUAL;
  automato[1][3]   = MENOR;
  automato[1][4]   = MAIOR;
  automato[1][5]   = MAIS;
  automato[1][6]   = MENOS;
  automato[1][7]   = VEZES;
  automato[1][8]   = BARRA;
  automato[1][9]   = DOISPONTOS;
  automato[1][10]  = ABREPAR;
  automato[1][11]  = FECHAPAR;
  automato[1][12]  = ABRECOCH;
  automato[1][13]  = FECHACOCH;
  automato[1][14]  = ABRECOMENTARIO;
  automato[1][15]  = FECHACOMENTARIO;
  automato[1][16]  = VIRGULA;
  automato[1][17]  = BARRAN;
  automato[1][18]  = WHITE;
  automato[1][19]  = PONTOVIRGULA;
  automato[1][20]  = PONTO;
  automato[1][21]  = TAB;
  automato[LETRA][LETRA - 2]   = LETRA;
  automato[DIGITO][DIGITO - 2] = DIGITO;
  automato[MENOR][IGUAL - 2]   = MENORIGUAL;
  automato[MENOR][MAIOR - 2]   = DIFERENTE;
  automato[MAIOR][IGUAL - 2]   = MAIORIGUAL;
  automato[DOISPONTOS][IGUAL - 2]   = DOISPONTOSIGUAL;
  automato[BARRA][BARRA - 2]  = BARRABARRA;
  automato[ABREPAR][FECHAPAR - 2]  = ABREFECHAPAR;
  automato[ABRECOMENTARIO][FECHACOMENTARIO - 2]  = ABREFECHACOMENTARIO;

  indice[0]  = 'a';
  indice[1]  = '0';
  indice[2]  = '=';
  indice[3]  = '<';
  indice[4]  = '>';
  indice[5]  = '+';
  indice[6]  = '-';
  indice[7]  = '*';
  indice[8]  = '/';
  indice[9]  = ':';
  indice[10] = '(';
  indice[11] = ')';
  indice[12] = '[';
  indice[13] = ']';
  indice[14] = '{';
  indice[15] = '}';
  indice[16] = ',';
  indice[17] = '\n';
  indice[18] = ' ';
  indice[19] = ';';
  indice[20] = '.';
  indice[21] = '\t';
}